

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void Js::FunctionBody::ProfileSetNativeEntryPoint
               (FunctionEntryPointInfo *entryPointInfo,FunctionBody *functionBody,
               JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptMethod entryPoint_local;
  FunctionBody *functionBody_local;
  FunctionEntryPointInfo *entryPointInfo_local;
  
  bVar2 = ParseableFunctionInfo::IsWasmFunction(&functionBody->super_ParseableFunctionInfo);
  if (bVar2) {
    SetNativeEntryPoint(functionBody,entryPointInfo,entryPoint,entryPoint);
  }
  else {
    if (((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
        CurrentThunk != ScriptContext::DebugProfileProbeThunk) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf9a,
                                  "(functionBody->m_scriptContext->CurrentThunk == Js::ScriptContext::DebugProfileProbeThunk)"
                                  ,
                                  "functionBody->m_scriptContext->CurrentThunk == ProfileEntryThunk"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    SetNativeEntryPoint(functionBody,entryPointInfo,entryPoint,ScriptContext::DebugProfileProbeThunk
                       );
  }
  return;
}

Assistant:

void FunctionBody::ProfileSetNativeEntryPoint(FunctionEntryPointInfo* entryPointInfo, FunctionBody * functionBody, JavascriptMethod entryPoint)
    {
#ifdef ENABLE_WASM
        // Do not profile WebAssembly functions
        if (functionBody->IsWasmFunction())
        {
            functionBody->SetNativeEntryPoint(entryPointInfo, entryPoint, entryPoint);
            return;
        }
#endif
        Assert(functionBody->m_scriptContext->CurrentThunk == ProfileEntryThunk);
        functionBody->SetNativeEntryPoint(entryPointInfo, entryPoint, ProfileEntryThunk);
    }